

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteSpherical.cpp
# Opt level: O2

ChCoordsys<double> * __thiscall
chrono::ChLinkRevoluteSpherical::GetLinkRelativeCoords
          (ChCoordsys<double> *__return_storage_ptr__,ChLinkRevoluteSpherical *this)

{
  ChFrame<double> *pCVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ChMatrix33<double> A;
  ChVector<double> pos1;
  ChVector<double> w;
  ChVector<double> u;
  undefined1 local_e8 [16];
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  undefined1 local_98 [16];
  double local_88;
  ChVector<double> local_80;
  ChVector<double> local_68;
  ChQuaternion<double> local_50;
  
  pCVar1 = (ChFrame<double> *)(this->super_ChLink).Body2;
  ChFrame<double>::TransformPointLocalToParent
            ((ChVector<double> *)local_e8,(ChFrame<double> *)(this->super_ChLink).Body1,
             &this->m_pos1);
  ChFrame<double>::TransformPointParentToLocal
            ((ChVector<double> *)local_98,pCVar1,(ChVector<double> *)local_e8);
  local_e8 = vsubpd_avx(*(undefined1 (*) [16])(this->m_pos2).m_data,local_98);
  local_d8 = (this->m_pos2).m_data[2] - local_88;
  ChVector<double>::GetNormalized(&local_68,(ChVector<double> *)local_e8);
  pCVar1 = (ChFrame<double> *)(this->super_ChLink).Body2;
  ChMatrix33<double>::operator*
            (&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
              Amatrix,&this->m_dir1);
  ChFrame<double>::TransformDirectionParentToLocal(&local_80,pCVar1,(ChVector<double> *)local_e8);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_68.m_data[0];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_80.m_data[1];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_80.m_data[0];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_68.m_data[2];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_80.m_data[2];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_68.m_data[1];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_68.m_data[1] * local_80.m_data[2];
  auVar4 = vfmsub231sd_fma(auVar10,auVar4,auVar6);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_68.m_data[2] * local_80.m_data[0];
  auVar6 = vfmsub231sd_fma(auVar11,auVar7,auVar8);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_68.m_data[0] * local_80.m_data[1];
  auVar2 = vfmsub231sd_fma(auVar12,auVar2,auVar9);
  local_e8._8_8_ = auVar4._0_8_;
  local_e8._0_8_ = local_68.m_data[0];
  local_d8 = local_80.m_data[0];
  local_d0 = local_68.m_data[1];
  local_c8 = auVar6._0_8_;
  local_c0 = local_80.m_data[1];
  local_b8 = local_68.m_data[2];
  local_b0 = auVar2._0_8_;
  local_a8 = local_80.m_data[2];
  ChMatrix33<double>::Get_A_quaternion(&local_50,(ChMatrix33<double> *)local_e8);
  auVar3._8_8_ = local_88;
  auVar3._0_8_ = local_88;
  auVar3._16_8_ = local_88;
  auVar3._24_8_ = local_88;
  auVar3 = vblendps_avx(ZEXT1632(local_98),auVar3,0x30);
  auVar5._8_8_ = local_50.m_data[0];
  auVar5._0_8_ = local_50.m_data[0];
  auVar5._16_8_ = local_50.m_data[0];
  auVar5._24_8_ = local_50.m_data[0];
  auVar3 = vblendps_avx(auVar3,auVar5,0xc0);
  __return_storage_ptr__->pos = (ChVector<double>)auVar3._0_24_;
  (__return_storage_ptr__->rot).m_data[0] = (double)auVar3._24_8_;
  (__return_storage_ptr__->rot).m_data[1] = local_50.m_data[1];
  (__return_storage_ptr__->rot).m_data[2] = local_50.m_data[2];
  (__return_storage_ptr__->rot).m_data[3] = local_50.m_data[3];
  return __return_storage_ptr__;
}

Assistant:

ChCoordsys<> ChLinkRevoluteSpherical::GetLinkRelativeCoords() {
    ChVector<> pos1 = Body2->TransformPointParentToLocal(Body1->TransformPointLocalToParent(m_pos1));

    ChVector<> u = (m_pos2 - pos1).GetNormalized();
    ChVector<> w = Body2->TransformDirectionParentToLocal(Body1->TransformDirectionLocalToParent(m_dir1));
    ChVector<> v = Vcross(w, u);
    ChMatrix33<> A(u, v, w);

    return ChCoordsys<>(pos1, A.Get_A_quaternion());
}